

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemStringify(Mem *pMem,u8 enc,u8 bForce)

{
  int iVar1;
  size_t sVar2;
  int nByte;
  u8 bForce_local;
  u8 enc_local;
  Mem *pMem_local;
  
  iVar1 = sqlite3VdbeMemClearAndResize(pMem,0x20);
  if (iVar1 == 0) {
    vdbeMemRenderNum(0x20,pMem->z,pMem);
    sVar2 = strlen(pMem->z);
    pMem->n = (uint)sVar2 & 0x3fffffff;
    pMem->enc = '\x01';
    pMem->flags = pMem->flags | 0x202;
    if (bForce != '\0') {
      pMem->flags = pMem->flags & 0xffd3;
    }
    sqlite3VdbeChangeEncoding(pMem,(uint)enc);
    pMem_local._4_4_ = 0;
  }
  else {
    pMem->enc = '\0';
    pMem_local._4_4_ = 7;
  }
  return pMem_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemStringify(Mem *pMem, u8 enc, u8 bForce){
  const int nByte = 32;

  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !(pMem->flags&MEM_Zero) );
  assert( !(pMem->flags&(MEM_Str|MEM_Blob)) );
  assert( pMem->flags&(MEM_Int|MEM_Real|MEM_IntReal) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );


  if( sqlite3VdbeMemClearAndResize(pMem, nByte) ){
    pMem->enc = 0;
    return SQLITE_NOMEM_BKPT;
  }

  vdbeMemRenderNum(nByte, pMem->z, pMem);
  assert( pMem->z!=0 );
  pMem->n = sqlite3Strlen30NN(pMem->z);
  pMem->enc = SQLITE_UTF8;
  pMem->flags |= MEM_Str|MEM_Term;
  if( bForce ) pMem->flags &= ~(MEM_Int|MEM_Real|MEM_IntReal);
  sqlite3VdbeChangeEncoding(pMem, enc);
  return SQLITE_OK;
}